

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.h
# Opt level: O1

void __thiscall
Symbol::Symbol(Symbol *this,string *name,vector<int,_std::allocator<int>_> *value,bool *is_assigned)

{
  pointer pcVar1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  this->type_ = kIntArray;
  (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&this->ret_type_ = 0;
  *(undefined8 *)
   ((long)&(this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->value_).args.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->is_assigned_ = true;
  std::vector<int,_std::allocator<int>_>::operator=(&(this->value_).int_array,value);
  return;
}

Assistant:

Symbol(const std::string &name, const std::vector<int> &value, const bool &is_assigned) :
            name_(name), type_(Symbol::Type::kIntArray), ret_type_(Symbol::Type::kNone), is_assigned_(true) {
        value_.int_array = value;
    }